

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O0

int mmdelm_(int *mdnode,int *xadj,int *adjncy,int *dhead,int *dforw,int *dbakw,int *qsize,int *llist
           ,int *marker,int *maxint,int *tag)

{
  int iVar1;
  int iVar2;
  int i__2;
  int i__1;
  int *dbakw_local;
  int *dforw_local;
  int *dhead_local;
  int *adjncy_local;
  int *xadj_local;
  int *mdnode_local;
  
  marker[(long)*mdnode + -1] = *tag;
  mmdelm_::rloc = xadj[(long)*mdnode + -1];
  iVar1 = xadj[(long)(*mdnode + 1) + -1];
  mmdelm_::elmnt = 0;
  mmdelm_::rlmt = iVar1 + -1;
  mmdelm_::i = mmdelm_::rloc;
  while ((mmdelm_::i <= iVar1 + -1 &&
         (mmdelm_::nabor = adjncy[(long)mmdelm_::i + -1], mmdelm_::nabor != 0))) {
    if (marker[(long)mmdelm_::nabor + -1] < *tag) {
      marker[(long)mmdelm_::nabor + -1] = *tag;
      if (dforw[(long)mmdelm_::nabor + -1] < 0) {
        llist[(long)mmdelm_::nabor + -1] = mmdelm_::elmnt;
        mmdelm_::elmnt = mmdelm_::nabor;
      }
      else {
        adjncy[(long)mmdelm_::rloc + -1] = mmdelm_::nabor;
        mmdelm_::rloc = mmdelm_::rloc + 1;
      }
    }
    mmdelm_::i = mmdelm_::i + 1;
  }
LAB_00180c08:
  if (mmdelm_::elmnt < 1) {
    if (mmdelm_::rloc <= mmdelm_::rlmt) {
      adjncy[(long)mmdelm_::rloc + -1] = 0;
    }
    mmdelm_::link = *mdnode;
    do {
      mmdelm_::i = xadj[(long)mmdelm_::link + -1];
      iVar1 = xadj[(long)(mmdelm_::link + 1) + -1];
      mmdelm_::istop = iVar1 + -1;
      mmdelm_::istrt = mmdelm_::i;
      while( true ) {
        if (iVar1 + -1 < mmdelm_::i) {
          return 0;
        }
        mmdelm_::rnode = adjncy[(long)mmdelm_::i + -1];
        mmdelm_::link = -mmdelm_::rnode;
        if (mmdelm_::rnode < 0) break;
        if (mmdelm_::rnode == 0) {
          return 0;
        }
        mmdelm_::pvnode = dbakw[(long)mmdelm_::rnode + -1];
        if ((mmdelm_::pvnode != 0) && (mmdelm_::pvnode != -*maxint)) {
          mmdelm_::nxnode = dforw[(long)mmdelm_::rnode + -1];
          if (0 < mmdelm_::nxnode) {
            dbakw[(long)mmdelm_::nxnode + -1] = mmdelm_::pvnode;
          }
          if (0 < mmdelm_::pvnode) {
            dforw[(long)mmdelm_::pvnode + -1] = mmdelm_::nxnode;
          }
          mmdelm_::npv = -mmdelm_::pvnode;
          if (mmdelm_::pvnode < 0) {
            dhead[(long)mmdelm_::npv + -1] = mmdelm_::nxnode;
          }
        }
        mmdelm_::j = xadj[(long)mmdelm_::rnode + -1];
        iVar2 = xadj[(long)(mmdelm_::rnode + 1) + -1];
        mmdelm_::xqnbr = mmdelm_::j;
        mmdelm_::jstop = iVar2 + -1;
        mmdelm_::jstrt = mmdelm_::j;
        while ((mmdelm_::j <= iVar2 + -1 &&
               (mmdelm_::nabor = adjncy[(long)mmdelm_::j + -1], mmdelm_::nabor != 0))) {
          if (marker[(long)mmdelm_::nabor + -1] < *tag) {
            adjncy[(long)mmdelm_::xqnbr + -1] = mmdelm_::nabor;
            mmdelm_::xqnbr = mmdelm_::xqnbr + 1;
          }
          mmdelm_::j = mmdelm_::j + 1;
        }
        mmdelm_::nqnbrs = mmdelm_::xqnbr - mmdelm_::jstrt;
        if (mmdelm_::nqnbrs < 1) {
          qsize[(long)*mdnode + -1] = qsize[(long)mmdelm_::rnode + -1] + qsize[(long)*mdnode + -1];
          qsize[(long)mmdelm_::rnode + -1] = 0;
          marker[(long)mmdelm_::rnode + -1] = *maxint;
          dforw[(long)mmdelm_::rnode + -1] = -*mdnode;
          dbakw[(long)mmdelm_::rnode + -1] = -*maxint;
        }
        else {
          dforw[(long)mmdelm_::rnode + -1] = mmdelm_::nqnbrs + 1;
          dbakw[(long)mmdelm_::rnode + -1] = 0;
          adjncy[(long)mmdelm_::xqnbr + -1] = *mdnode;
          mmdelm_::xqnbr = mmdelm_::xqnbr + 1;
          if (mmdelm_::xqnbr <= mmdelm_::jstop) {
            adjncy[(long)mmdelm_::xqnbr + -1] = 0;
          }
        }
        mmdelm_::i = mmdelm_::i + 1;
      }
    } while( true );
  }
  adjncy[(long)mmdelm_::rlmt + -1] = -mmdelm_::elmnt;
  mmdelm_::link = mmdelm_::elmnt;
LAB_00180c38:
  mmdelm_::j = xadj[(long)mmdelm_::link + -1];
  iVar1 = xadj[(long)(mmdelm_::link + 1) + -1];
  mmdelm_::jstop = iVar1 + -1;
  mmdelm_::jstrt = mmdelm_::j;
  do {
    if (iVar1 + -1 < mmdelm_::j) {
LAB_00180d9f:
      mmdelm_::elmnt = llist[(long)mmdelm_::elmnt + -1];
      goto LAB_00180c08;
    }
    mmdelm_::node = adjncy[(long)mmdelm_::j + -1];
    mmdelm_::link = -mmdelm_::node;
    if (mmdelm_::node < 0) goto LAB_00180c38;
    if (mmdelm_::node == 0) goto LAB_00180d9f;
    if ((marker[(long)mmdelm_::node + -1] < *tag) && (-1 < dforw[(long)mmdelm_::node + -1])) {
      marker[(long)mmdelm_::node + -1] = *tag;
      for (; mmdelm_::rlmt <= mmdelm_::rloc;
          mmdelm_::rlmt = xadj[(long)(-adjncy[(long)mmdelm_::rlmt + -1] + 1) + -1] + -1) {
        mmdelm_::rloc = xadj[(long)-adjncy[(long)mmdelm_::rlmt + -1] + -1];
      }
      adjncy[(long)mmdelm_::rloc + -1] = mmdelm_::node;
      mmdelm_::rloc = mmdelm_::rloc + 1;
    }
    mmdelm_::j = mmdelm_::j + 1;
  } while( true );
}

Assistant:

int mmdelm_(int* mdnode, int* xadj, int* adjncy, int* dhead, int* dforw,
            int* dbakw, int* qsize, int* llist, int* marker,
            int* maxint, int* tag)
{
    /* System generated locals */
    int i__1, i__2;

    /* Local variables */
    static int node, link, rloc, rlmt, i, j, nabor, rnode, elmnt, xqnbr,
            istop, jstop, istrt, jstrt, nxnode, pvnode, nqnbrs, npv;


/* *************************************************************** */

/*         INTEGER*2  ADJNCY(1), DBAKW(1) , DFORW(1) , DHEAD(1) , */
/*     1              LLIST(1) , MARKER(1), QSIZE(1) */

/* *************************************************************** */

/*        ----------------------------------------------- */
/*        FIND REACHABLE SET AND PLACE IN DATA STRUCTURE. */
/*        ----------------------------------------------- */
    /* Parameter adjustments */
    --marker; --llist; --qsize; --dbakw; --dforw; --dhead;
    --adjncy; --xadj;

    /* Function Body */
    marker[*mdnode] = *tag;
    istrt = xadj[*mdnode];
    istop = xadj[*mdnode + 1] - 1;
/*        ------------------------------------------------------- */
/*        ELMNT POINTS TO THE BEGINNING OF THE LIST OF ELIMINATED */
/*        NABORS OF MDNODE, AND RLOC GIVES THE STORAGE LOCATION */
/*        FOR THE NEXT REACHABLE NODE. */
/*        ------------------------------------------------------- */
    elmnt = 0;
    rloc = istrt;
    rlmt = istop;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        nabor = adjncy[i];
        if (nabor == 0) {
            goto L300;
        }
        if (marker[nabor] >= *tag) {
            goto L200;
        }
        marker[nabor] = *tag;
        if (dforw[nabor] < 0) {
            goto L100;
        }
        adjncy[rloc] = nabor;
        ++rloc;
        goto L200;
L100:
        llist[nabor] = elmnt;
        elmnt = nabor;
L200:
        ;
    }
L300:
/*            ----------------------------------------------------- */
/*            MERGE WITH REACHABLE NODES FROM GENERALIZED ELEMENTS. */
/*            ----------------------------------------------------- */
    if (elmnt <= 0) {
        goto L1000;
    }
    adjncy[rlmt] = -elmnt;
    link = elmnt;
L400:
    jstrt = xadj[link];
    jstop = xadj[link + 1] - 1;
    i__1 = jstop;
    for (j = jstrt; j <= i__1; ++j) {
        node = adjncy[j];
        link = -node;
        if (node < 0) {
            goto L400;
        } else if (node == 0) {
            goto L900;
        } else {
            goto L500;
        }
L500:
        if (marker[node] >= *tag || dforw[node] < 0) {
            goto L800;
        }
        marker[node] = *tag;
/*                            --------------------------------- */
/*                            USE STORAGE FROM ELIMINATED NODES */
/*                            IF NECESSARY. */
/*                            --------------------------------- */
L600:
        if (rloc < rlmt) {
            goto L700;
        }
        link = -adjncy[rlmt];
        rloc = xadj[link];
        rlmt = xadj[link + 1] - 1;
        goto L600;
L700:
        adjncy[rloc] = node;
        ++rloc;
L800:
        ;
    }
L900:
    elmnt = llist[elmnt];
    goto L300;
L1000:
    if (rloc <= rlmt) {
        adjncy[rloc] = 0;
    }
/*        -------------------------------------------------------- */
/*        FOR EACH NODE IN THE REACHABLE SET, DO THE FOLLOWING ... */
/*        -------------------------------------------------------- */
    link = *mdnode;
L1100:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        rnode = adjncy[i];
        link = -rnode;
        if (rnode < 0) {
            goto L1100;
        } else if (rnode == 0) {
            goto L1800;
        } else {
            goto L1200;
        }
L1200:
/*                -------------------------------------------- */
/*                IF RNODE IS IN THE DEGREE LIST STRUCTURE ... */
/*                -------------------------------------------- */
        pvnode = dbakw[rnode];
        if (pvnode == 0 || pvnode == -(*maxint)) {
            goto L1300;
        }
/*                    ------------------------------------- */
/*                    THEN REMOVE RNODE FROM THE STRUCTURE. */
/*                    ------------------------------------- */
        nxnode = dforw[rnode];
        if (nxnode > 0) {
            dbakw[nxnode] = pvnode;
        }
        if (pvnode > 0) {
            dforw[pvnode] = nxnode;
        }
        npv = -pvnode;
        if (pvnode < 0) {
            dhead[npv] = nxnode;
        }
L1300:
/*                ---------------------------------------- */
/*                PURGE INACTIVE QUOTIENT NABORS OF RNODE. */
/*                ---------------------------------------- */
        jstrt = xadj[rnode];
        jstop = xadj[rnode + 1] - 1;
        xqnbr = jstrt;
        i__2 = jstop;
        for (j = jstrt; j <= i__2; ++j) {
            nabor = adjncy[j];
            if (nabor == 0) {
                goto L1500;
            }
            if (marker[nabor] >= *tag) {
                goto L1400;
            }
            adjncy[xqnbr] = nabor;
            ++xqnbr;
L1400:
            ;
        }
L1500:
/*                ---------------------------------------- */
/*                IF NO ACTIVE NABOR AFTER THE PURGING ... */
/*                ---------------------------------------- */
        nqnbrs = xqnbr - jstrt;
        if (nqnbrs > 0) {
            goto L1600;
        }
/*                    ----------------------------- */
/*                    THEN MERGE RNODE WITH MDNODE. */
/*                    ----------------------------- */
        qsize[*mdnode] += qsize[rnode];
        qsize[rnode] = 0;
        marker[rnode] = *maxint;
        dforw[rnode] = -(*mdnode);
        dbakw[rnode] = -(*maxint);
        goto L1700;
L1600:
/*                -------------------------------------- */
/*                ELSE FLAG RNODE FOR DEGREE UPDATE, AND */
/*                ADD MDNODE AS A NABOR OF RNODE. */
/*                -------------------------------------- */
        dforw[rnode] = nqnbrs + 1;
        dbakw[rnode] = 0;
        adjncy[xqnbr] = *mdnode;
        ++xqnbr;
        if (xqnbr <= jstop) {
            adjncy[xqnbr] = 0;
        }

L1700:
        ;
    }
L1800:
    return 0;

}